

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Runner::Runner(Runner *this,Config *config,Ptr<Catch::IReporter> *reporter)

{
  IReporter *pIVar1;
  int iVar2;
  IMutableContext *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__Runner_001b84f0;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&PTR__Runner_001b8558;
  pIVar3 = getCurrentMutableContext();
  this->m_context = pIVar3;
  this->m_runningTest = (RunningTest *)0x0;
  AssertionResult::AssertionResult(&this->m_lastResult);
  this->m_config = config;
  (this->m_totals).assertions.passed = 0;
  (this->m_totals).assertions.failed = 0;
  (this->m_totals).testCases.passed = 0;
  (this->m_totals).testCases.failed = 0;
  pIVar1 = reporter->m_p;
  (this->m_reporter).m_p = pIVar1;
  if (pIVar1 != (IReporter *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  (this->m_assertionResults).
  super__Vector_base<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_assertionResults).
  super__Vector_base<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_scopedInfos).
  super__Vector_base<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_assertionResults).
  super__Vector_base<Catch::AssertionResult,_std::allocator<Catch::AssertionResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_scopedInfos).
  super__Vector_base<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_scopedInfos).
  super__Vector_base<Catch::ScopedInfo_*,_std::allocator<Catch::ScopedInfo_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = (*(this->m_context->super_IContext)._vptr_IContext[3])();
  this->m_prevRunner = (IRunner *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(this->m_context->super_IContext)._vptr_IContext[2])();
  this->m_prevResultCapture = (IResultCapture *)CONCAT44(extraout_var_00,iVar2);
  iVar2 = (*(this->m_context->super_IContext)._vptr_IContext[6])();
  this->m_prevConfig = (IConfig *)CONCAT44(extraout_var_01,iVar2);
  AssertionInfo::AssertionInfo(&this->m_lastAssertionInfo);
  (*(this->m_context->super_IContext)._vptr_IContext[8])(this->m_context,&this->super_IRunner);
  (*(this->m_context->super_IContext)._vptr_IContext[9])(this->m_context,this->m_config);
  (*(this->m_context->super_IContext)._vptr_IContext[7])(this->m_context,this);
  (*(((this->m_reporter).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[5])();
  return;
}

Assistant:

explicit Runner( const Config& config, const Ptr<IReporter>& reporter )
        :   m_context( getCurrentMutableContext() ),
            m_runningTest( NULL ),
            m_config( config ),
            m_reporter( reporter ),
            m_prevRunner( &m_context.getRunner() ),
            m_prevResultCapture( &m_context.getResultCapture() ),
            m_prevConfig( m_context.getConfig() )
        {
            m_context.setRunner( this );
            m_context.setConfig( &m_config );
            m_context.setResultCapture( this );
            m_reporter->StartTesting();
        }